

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O3

void __thiscall
slang::ast::ASTVisitor<slang::ast::DiagnosticVisitor,_false,_false,_false,_false>::
visitDefault<slang::ast::SequenceSymbol>
          (ASTVisitor<slang::ast::DiagnosticVisitor,_false,_false,_false,_false> *this,
          SequenceSymbol *t)

{
  Symbol *member;
  Symbol *this_00;
  
  if ((t->super_Scope).deferredMemberIndex != Invalid) {
    Scope::elaborate(&t->super_Scope);
  }
  for (this_00 = (t->super_Scope).firstMember; this_00 != (Symbol *)0x0;
      this_00 = this_00->nextInScope) {
    Symbol::visit<slang::ast::DiagnosticVisitor&>(this_00,(DiagnosticVisitor *)this);
  }
  return;
}

Assistant:

void visitDefault(const T& t) {
        if constexpr (VisitExpressions && HasVisitExprs<T, TDerived>) {
            t.visitExprs(DERIVED);
        }
        else if constexpr (VisitExpressions && std::is_base_of_v<Symbol, T>) {
            if (auto declaredType = t.getDeclaredType()) {
                if (auto init = declaredType->getInitializer())
                    init->visit(DERIVED);
            }
        }

        if constexpr (VisitStatements && requires { t.visitStmts(DERIVED); }) {
            t.visitStmts(DERIVED);
        }

        if constexpr (std::is_base_of_v<GenericClassDefSymbol, T>) {
            for (auto&& spec : t.specializations())
                spec.visit(DERIVED);
        }

        if constexpr (std::is_base_of_v<Scope, T>) {
            for (auto& member : t.members())
                member.visit(DERIVED);
        }

        if constexpr (std::is_same_v<InstanceSymbol, T>) {
            if constexpr (VisitCanonical) {
                const auto& body = t.getCanonicalBody() ? *t.getCanonicalBody() : t.body;
                body.visit(DERIVED);
            }
            else {
                t.body.visit(DERIVED);
            }
        }

        if constexpr (std::is_same_v<CheckerInstanceSymbol, T>) {
            t.body.visit(DERIVED);
        }
    }